

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O0

int SSL_SESSION_to_bytes(SSL_SESSION *in,uint8_t **out_data,size_t *out_len)

{
  int iVar1;
  uint8_t *puVar2;
  cbb_st *pcVar3;
  undefined1 local_58 [8];
  ScopedCBB cbb;
  size_t *out_len_local;
  uint8_t **out_data_local;
  SSL_SESSION *in_local;
  
  cbb.ctx_.u._24_8_ = out_len;
  if (((byte)in->field_0x1b8 >> 2 & 1) != 0) {
    *out_len = 0xd;
    puVar2 = (uint8_t *)OPENSSL_memdup("NOT RESUMABLE",*out_len);
    *out_data = puVar2;
    if (*out_data == (uint8_t *)0x0) {
      return 0;
    }
    return 1;
  }
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
  iVar1 = CBB_init(pcVar3,0x100);
  if (iVar1 != 0) {
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
    iVar1 = bssl::SSL_SESSION_to_bytes_full(in,pcVar3,0);
    if (iVar1 != 0) {
      pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
      iVar1 = CBB_finish(pcVar3,out_data,(size_t *)cbb.ctx_.u._24_8_);
      if (iVar1 != 0) {
        in_local._4_4_ = 1;
        goto LAB_00367d78;
      }
    }
  }
  in_local._4_4_ = 0;
LAB_00367d78:
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
  return in_local._4_4_;
}

Assistant:

int SSL_SESSION_to_bytes(const SSL_SESSION *in, uint8_t **out_data,
                         size_t *out_len) {
  if (in->not_resumable) {
    // If the caller has an unresumable session, e.g. if |SSL_get_session| were
    // called on a TLS 1.3 or False Started connection, serialize with a
    // placeholder value so it is not accidentally deserialized into a resumable
    // one.
    static const char kNotResumableSession[] = "NOT RESUMABLE";

    *out_len = strlen(kNotResumableSession);
    *out_data = (uint8_t *)OPENSSL_memdup(kNotResumableSession, *out_len);
    if (*out_data == NULL) {
      return 0;
    }

    return 1;
  }

  ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 256) ||
      !SSL_SESSION_to_bytes_full(in, cbb.get(), 0) ||
      !CBB_finish(cbb.get(), out_data, out_len)) {
    return 0;
  }

  return 1;
}